

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

int __thiscall
glcts::BlendEquationSeparateCase::init(BlendEquationSeparateCase *this,EVP_PKEY_CTX *ctx)

{
  GLenum mode;
  Context *pCVar1;
  int extraout_EAX;
  TestNode *node;
  char *name;
  long lVar2;
  
  lVar2 = 0;
  do {
    node = (TestNode *)operator_new(0x80);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    mode = *(GLenum *)((long)&s_modes + lVar2);
    name = GetModeStr(mode);
    tcu::TestCase::TestCase((TestCase *)node,pCVar1->m_testCtx,name,"Test one mode");
    node[1]._vptr_TestNode = (_func_int **)pCVar1;
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_02115538;
    *(GLenum *)&node[1].m_testCtx = mode;
    tcu::TestNode::addChild((TestNode *)this,node);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x3c);
  return extraout_EAX;
}

Assistant:

void init(void)
	{
		// Pump individual modes.
		for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_modes); i++)
			addChild(new ModeCase(m_context, s_modes[i]));
	}